

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

double __thiscall ON_Interval::Length(ON_Interval *this)

{
  double dVar1;
  
  dVar1 = 0.0;
  if ((ABS(this->m_t[0]) < 1.23432101234321e+308) && (ABS(this->m_t[1]) < 1.23432101234321e+308)) {
    dVar1 = this->m_t[1] - this->m_t[0];
  }
  return dVar1;
}

Assistant:

double
ON_Interval::Length() const
{
  return ( ON_IS_VALID(m_t[0]) && ON_IS_VALID(m_t[1]) ) ? m_t[1]-m_t[0] : 0.0;
}